

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempArenaAllocatorObject.cpp
# Opt level: O0

TempArenaAllocatorWrapper<false> *
Js::TempArenaAllocatorWrapper<false>::Create(ThreadContext *threadContext)

{
  Recycler *pRVar1;
  TempArenaAllocatorWrapper<false> *this;
  PageAllocator *pageAllocator;
  TrackAllocData local_48;
  TempArenaAllocatorWrapper<false> *wrapper;
  Recycler *recycler;
  ThreadContext *threadContext_local;
  
  recycler = (Recycler *)threadContext;
  pRVar1 = ThreadContext::GetRecycler(threadContext);
  wrapper = (TempArenaAllocatorWrapper<false> *)pRVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/TempArenaAllocatorObject.cpp"
             ,0xe);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (TempArenaAllocatorWrapper<false> *)new<Memory::Recycler>(0x98,pRVar1,0xaa04b0);
  pageAllocator = ThreadContext::GetPageAllocator((ThreadContext *)recycler);
  TempArenaAllocatorWrapper(this,L"temp",pageAllocator,Throw::OutOfMemory);
  return this;
}

Assistant:

TempArenaAllocatorWrapper<isGuestArena>* TempArenaAllocatorWrapper<isGuestArena>::Create(ThreadContext * threadContext)
    {
        Recycler * recycler = threadContext->GetRecycler();
        TempArenaAllocatorWrapper<isGuestArena> * wrapper = RecyclerNewFinalizedLeaf(recycler, Js::TempArenaAllocatorWrapper<isGuestArena>,
            _u("temp"), threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);
        if (isGuestArena)
        {
            wrapper->recycler = recycler;
            wrapper->AdviseInUse();
        }
        return wrapper;
    }